

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

uint8 * rw::xbox::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint8 *puVar4;
  long lVar5;
  
  if ((raster->privateFlags & 6U) != 0) {
    return (uint8 *)0x0;
  }
  lVar5 = (long)nativeRasterOffset;
  lVar2 = *(long *)((long)&raster->platform + lVar5);
  lVar3 = (long)level;
  puVar4 = *(uint8 **)(lVar2 + 0x18 + lVar3 * 0x18);
  raster->pixels = puVar4;
  iVar1 = *(int *)(lVar2 + 8 + lVar3 * 0x18);
  raster->width = iVar1;
  raster->height = *(int32 *)(lVar2 + 0xc + lVar3 * 0x18);
  raster->stride = iVar1 * *(int *)((long)&raster->width + lVar5);
  if ((lockMode & 2U) != 0) {
    raster->privateFlags = raster->privateFlags | 2;
  }
  if ((lockMode & 1U) == 0) {
    return puVar4;
  }
  *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 4;
  return puVar4;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	XboxRaster *natras = GETXBOXRASTEREXT(raster);

	// check if already locked
	if(raster->privateFlags & (Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE))
		return nil;

	RasterLevels *levels = (RasterLevels*)natras->texture;
	raster->pixels = levels->levels[level].data;
	raster->width = levels->levels[level].width;
	raster->height = levels->levels[level].height;
	raster->stride = raster->width*natras->bpp;

	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;

	return raster->pixels;
}